

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector_hybrid.cpp
# Opt level: O1

void embree::avx::
     BVHNIntersectorKHybrid<8,_4,_1,_false,_embree::avx::ArrayIntersectorK_1<4,_embree::avx::TriangleMIntersectorKMoeller<4,_4,_true>_>,_true>
     ::intersect1(Intersectors *This,BVH *bvh,NodeRef root,size_t k,Precalculations *pre,
                 RayHitK<4> *ray,TravRayK<4,_false> *tray,RayQueryContext *context)

{
  float *pfVar1;
  undefined4 uVar2;
  ulong uVar3;
  RTCFilterFunctionN p_Var4;
  float fVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  undefined1 auVar15 [32];
  undefined1 auVar16 [32];
  undefined1 auVar17 [32];
  undefined1 auVar18 [32];
  undefined1 auVar19 [32];
  undefined1 auVar20 [32];
  undefined1 auVar21 [32];
  float fVar22;
  float fVar23;
  float fVar24;
  float fVar25;
  float fVar26;
  float fVar27;
  float fVar28;
  float fVar29;
  float fVar30;
  float fVar31;
  float fVar32;
  float fVar33;
  float fVar34;
  float fVar35;
  float fVar36;
  float fVar37;
  float fVar38;
  float fVar39;
  float fVar40;
  float fVar41;
  float fVar42;
  float fVar43;
  float fVar44;
  float fVar45;
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  int iVar48;
  Geometry *pGVar49;
  Scene *pSVar50;
  long lVar51;
  ulong uVar52;
  long lVar53;
  undefined1 (*pauVar54) [16];
  undefined1 (*pauVar55) [16];
  undefined1 (*pauVar56) [16];
  ulong uVar57;
  undefined1 (*pauVar58) [16];
  ulong uVar59;
  Geometry *pGVar60;
  ulong uVar61;
  ulong uVar62;
  undefined4 uVar63;
  ulong unaff_R12;
  ulong uVar64;
  long lVar65;
  ulong uVar66;
  ulong uVar67;
  float fVar68;
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  float fVar77;
  undefined1 auVar73 [16];
  float fVar75;
  float fVar76;
  undefined1 auVar74 [64];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  undefined1 auVar90 [16];
  undefined1 auVar91 [16];
  undefined1 auVar92 [16];
  undefined1 auVar93 [16];
  undefined1 auVar94 [16];
  undefined1 auVar95 [16];
  undefined1 auVar96 [16];
  undefined1 auVar97 [16];
  undefined1 auVar98 [16];
  float fVar99;
  undefined1 auVar100 [32];
  undefined1 auVar101 [64];
  undefined1 auVar102 [32];
  undefined1 auVar103 [64];
  undefined1 auVar104 [32];
  undefined1 auVar105 [64];
  undefined1 auVar106 [64];
  uint uVar107;
  uint uVar109;
  uint uVar110;
  uint uVar111;
  undefined1 auVar108 [64];
  undefined1 auVar112 [64];
  undefined1 auVar113 [16];
  undefined1 auVar114 [16];
  undefined1 auVar115 [16];
  undefined1 auVar116 [16];
  undefined1 auVar117 [64];
  undefined1 auVar118 [16];
  undefined1 auVar119 [16];
  vbool<4> valid;
  RTCFilterFunctionNArguments args;
  vfloat<8> tNear;
  HitK<4> h;
  StackItemT<embree::NodeRefPtr<8>_> stack [564];
  undefined8 local_26c0;
  undefined8 uStack_26b8;
  undefined8 local_26a0;
  undefined8 uStack_2698;
  undefined1 local_2680 [16];
  undefined1 local_2670 [16];
  undefined1 local_2660 [16];
  Scene *local_2650;
  undefined8 uStack_2648;
  undefined8 local_2640;
  undefined8 uStack_2638;
  long local_2630;
  ulong local_2628;
  undefined8 *local_2620;
  ulong local_2618;
  RTCFilterFunctionNArguments local_2610;
  undefined1 local_25e0 [32];
  undefined1 local_25c0 [16];
  undefined1 local_25b0 [16];
  undefined1 local_2590 [16];
  float local_2580 [4];
  float local_2570 [4];
  undefined1 local_2560 [16];
  undefined1 local_2550 [16];
  undefined8 local_2540;
  undefined8 uStack_2538;
  undefined8 local_2530;
  undefined8 uStack_2528;
  undefined1 local_2520 [16];
  RTCHitN local_2510 [16];
  undefined1 local_2500 [16];
  undefined1 local_24f0 [16];
  undefined1 local_24e0 [16];
  float local_24d0;
  float fStack_24cc;
  float fStack_24c8;
  float fStack_24c4;
  undefined1 local_24c0 [16];
  undefined1 local_24b0 [16];
  uint local_24a0;
  uint uStack_249c;
  uint uStack_2498;
  uint uStack_2494;
  uint uStack_2490;
  uint uStack_248c;
  uint uStack_2488;
  uint uStack_2484;
  undefined1 local_2480 [32];
  undefined1 local_2460 [32];
  undefined1 local_2440 [32];
  undefined1 local_2420 [32];
  undefined1 local_2400 [32];
  undefined1 local_23e0 [32];
  undefined1 local_23c0 [32];
  size_t local_23a0;
  undefined4 uStack_2398;
  undefined1 local_2390 [9056];
  
  pauVar56 = (undefined1 (*) [16])local_2390;
  local_23a0 = root.ptr;
  uStack_2398 = 0;
  uVar63 = *(undefined4 *)((long)&(tray->org).field_0 + k * 4);
  local_23c0._4_4_ = uVar63;
  local_23c0._0_4_ = uVar63;
  local_23c0._8_4_ = uVar63;
  local_23c0._12_4_ = uVar63;
  local_23c0._16_4_ = uVar63;
  local_23c0._20_4_ = uVar63;
  local_23c0._24_4_ = uVar63;
  local_23c0._28_4_ = uVar63;
  auVar101 = ZEXT3264(local_23c0);
  uVar63 = *(undefined4 *)((long)&(tray->org).field_0 + k * 4 + 0x10);
  local_23e0._4_4_ = uVar63;
  local_23e0._0_4_ = uVar63;
  local_23e0._8_4_ = uVar63;
  local_23e0._12_4_ = uVar63;
  local_23e0._16_4_ = uVar63;
  local_23e0._20_4_ = uVar63;
  local_23e0._24_4_ = uVar63;
  local_23e0._28_4_ = uVar63;
  auVar103 = ZEXT3264(local_23e0);
  uVar63 = *(undefined4 *)((long)&(tray->org).field_0 + k * 4 + 0x20);
  local_2400._4_4_ = uVar63;
  local_2400._0_4_ = uVar63;
  local_2400._8_4_ = uVar63;
  local_2400._12_4_ = uVar63;
  local_2400._16_4_ = uVar63;
  local_2400._20_4_ = uVar63;
  local_2400._24_4_ = uVar63;
  local_2400._28_4_ = uVar63;
  auVar105 = ZEXT3264(local_2400);
  uVar63 = *(undefined4 *)((long)&(tray->rdir).field_0 + k * 4);
  local_2420._4_4_ = uVar63;
  local_2420._0_4_ = uVar63;
  local_2420._8_4_ = uVar63;
  local_2420._12_4_ = uVar63;
  local_2420._16_4_ = uVar63;
  local_2420._20_4_ = uVar63;
  local_2420._24_4_ = uVar63;
  local_2420._28_4_ = uVar63;
  auVar106 = ZEXT3264(local_2420);
  uVar63 = *(undefined4 *)((long)&(tray->rdir).field_0 + k * 4 + 0x10);
  local_2440._4_4_ = uVar63;
  local_2440._0_4_ = uVar63;
  local_2440._8_4_ = uVar63;
  local_2440._12_4_ = uVar63;
  local_2440._16_4_ = uVar63;
  local_2440._20_4_ = uVar63;
  local_2440._24_4_ = uVar63;
  local_2440._28_4_ = uVar63;
  auVar108 = ZEXT3264(local_2440);
  uVar63 = *(undefined4 *)((long)&(tray->rdir).field_0 + k * 4 + 0x20);
  local_2460._4_4_ = uVar63;
  local_2460._0_4_ = uVar63;
  local_2460._8_4_ = uVar63;
  local_2460._12_4_ = uVar63;
  local_2460._16_4_ = uVar63;
  local_2460._20_4_ = uVar63;
  local_2460._24_4_ = uVar63;
  local_2460._28_4_ = uVar63;
  auVar112 = ZEXT3264(local_2460);
  uVar57 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4);
  uVar61 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4 + 0x10);
  uVar62 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4 + 0x20);
  uVar52 = uVar57 ^ 0x20;
  uVar64 = uVar61 ^ 0x20;
  iVar48 = (tray->tnear).field_0.i[k];
  local_2480._4_4_ = iVar48;
  local_2480._0_4_ = iVar48;
  local_2480._8_4_ = iVar48;
  local_2480._12_4_ = iVar48;
  local_2480._16_4_ = iVar48;
  local_2480._20_4_ = iVar48;
  local_2480._24_4_ = iVar48;
  local_2480._28_4_ = iVar48;
  auVar117 = ZEXT3264(local_2480);
  local_2618 = uVar62 ^ 0x20;
  iVar48 = (tray->tfar).field_0.i[k];
  auVar74 = ZEXT3264(CONCAT428(iVar48,CONCAT424(iVar48,CONCAT420(iVar48,CONCAT416(iVar48,CONCAT412(
                                                  iVar48,CONCAT48(iVar48,CONCAT44(iVar48,iVar48)))))
                                               )));
  local_2620 = (undefined8 *)(mm_lookupmask_ps + (long)(1 << ((byte)k & 0x1f)) * 0x10);
  do {
    do {
      do {
        if (pauVar56 == (undefined1 (*) [16])&local_23a0) {
          return;
        }
        pauVar54 = pauVar56 + -1;
        pauVar56 = pauVar56 + -1;
      } while (*(float *)(ray + k * 4 + 0x80) < *(float *)(*pauVar54 + 8));
      uVar67 = *(ulong *)*pauVar56;
      do {
        auVar104 = auVar105._0_32_;
        auVar102 = auVar103._0_32_;
        auVar100 = auVar101._0_32_;
        if ((uVar67 & 8) == 0) {
          auVar15 = vsubps_avx(*(undefined1 (*) [32])(uVar67 + 0x40 + uVar57),auVar100);
          auVar16._4_4_ = auVar106._4_4_ * auVar15._4_4_;
          auVar16._0_4_ = auVar106._0_4_ * auVar15._0_4_;
          auVar16._8_4_ = auVar106._8_4_ * auVar15._8_4_;
          auVar16._12_4_ = auVar106._12_4_ * auVar15._12_4_;
          auVar16._16_4_ = auVar106._16_4_ * auVar15._16_4_;
          auVar16._20_4_ = auVar106._20_4_ * auVar15._20_4_;
          auVar16._24_4_ = auVar106._24_4_ * auVar15._24_4_;
          auVar16._28_4_ = auVar15._28_4_;
          auVar15 = vsubps_avx(*(undefined1 (*) [32])(uVar67 + 0x40 + uVar61),auVar102);
          auVar17._4_4_ = auVar108._4_4_ * auVar15._4_4_;
          auVar17._0_4_ = auVar108._0_4_ * auVar15._0_4_;
          auVar17._8_4_ = auVar108._8_4_ * auVar15._8_4_;
          auVar17._12_4_ = auVar108._12_4_ * auVar15._12_4_;
          auVar17._16_4_ = auVar108._16_4_ * auVar15._16_4_;
          auVar17._20_4_ = auVar108._20_4_ * auVar15._20_4_;
          auVar17._24_4_ = auVar108._24_4_ * auVar15._24_4_;
          auVar17._28_4_ = auVar15._28_4_;
          auVar15 = vmaxps_avx(auVar16,auVar17);
          auVar16 = vsubps_avx(*(undefined1 (*) [32])(uVar67 + 0x40 + uVar62),auVar104);
          auVar18._4_4_ = auVar112._4_4_ * auVar16._4_4_;
          auVar18._0_4_ = auVar112._0_4_ * auVar16._0_4_;
          auVar18._8_4_ = auVar112._8_4_ * auVar16._8_4_;
          auVar18._12_4_ = auVar112._12_4_ * auVar16._12_4_;
          auVar18._16_4_ = auVar112._16_4_ * auVar16._16_4_;
          auVar18._20_4_ = auVar112._20_4_ * auVar16._20_4_;
          auVar18._24_4_ = auVar112._24_4_ * auVar16._24_4_;
          auVar18._28_4_ = auVar16._28_4_;
          auVar16 = vmaxps_avx(auVar18,auVar117._0_32_);
          local_25e0 = vmaxps_avx(auVar15,auVar16);
          auVar15 = vsubps_avx(*(undefined1 (*) [32])(uVar67 + 0x40 + uVar52),auVar100);
          auVar19._4_4_ = auVar106._4_4_ * auVar15._4_4_;
          auVar19._0_4_ = auVar106._0_4_ * auVar15._0_4_;
          auVar19._8_4_ = auVar106._8_4_ * auVar15._8_4_;
          auVar19._12_4_ = auVar106._12_4_ * auVar15._12_4_;
          auVar19._16_4_ = auVar106._16_4_ * auVar15._16_4_;
          auVar19._20_4_ = auVar106._20_4_ * auVar15._20_4_;
          auVar19._24_4_ = auVar106._24_4_ * auVar15._24_4_;
          auVar19._28_4_ = auVar15._28_4_;
          auVar15 = vsubps_avx(*(undefined1 (*) [32])(uVar67 + 0x40 + uVar64),auVar102);
          auVar20._4_4_ = auVar108._4_4_ * auVar15._4_4_;
          auVar20._0_4_ = auVar108._0_4_ * auVar15._0_4_;
          auVar20._8_4_ = auVar108._8_4_ * auVar15._8_4_;
          auVar20._12_4_ = auVar108._12_4_ * auVar15._12_4_;
          auVar20._16_4_ = auVar108._16_4_ * auVar15._16_4_;
          auVar20._20_4_ = auVar108._20_4_ * auVar15._20_4_;
          auVar20._24_4_ = auVar108._24_4_ * auVar15._24_4_;
          auVar20._28_4_ = auVar15._28_4_;
          auVar15 = vminps_avx(auVar19,auVar20);
          auVar16 = vsubps_avx(*(undefined1 (*) [32])(uVar67 + 0x40 + local_2618),auVar104);
          auVar21._4_4_ = auVar112._4_4_ * auVar16._4_4_;
          auVar21._0_4_ = auVar112._0_4_ * auVar16._0_4_;
          auVar21._8_4_ = auVar112._8_4_ * auVar16._8_4_;
          auVar21._12_4_ = auVar112._12_4_ * auVar16._12_4_;
          auVar21._16_4_ = auVar112._16_4_ * auVar16._16_4_;
          auVar21._20_4_ = auVar112._20_4_ * auVar16._20_4_;
          auVar21._24_4_ = auVar112._24_4_ * auVar16._24_4_;
          auVar21._28_4_ = auVar16._28_4_;
          auVar16 = vminps_avx(auVar21,auVar74._0_32_);
          auVar15 = vminps_avx(auVar15,auVar16);
          auVar15 = vcmpps_avx(local_25e0,auVar15,2);
          uVar63 = vmovmskps_avx(auVar15);
          unaff_R12 = CONCAT44((int)(unaff_R12 >> 0x20),uVar63);
        }
        if ((uVar67 & 8) == 0) {
          if (unaff_R12 == 0) {
            iVar48 = 4;
          }
          else {
            uVar66 = uVar67 & 0xfffffffffffffff0;
            lVar51 = 0;
            if (unaff_R12 != 0) {
              for (; (unaff_R12 >> lVar51 & 1) == 0; lVar51 = lVar51 + 1) {
              }
            }
            iVar48 = 0;
            uVar67 = *(ulong *)(uVar66 + lVar51 * 8);
            uVar59 = unaff_R12 - 1 & unaff_R12;
            if (uVar59 != 0) {
              uVar107 = *(uint *)(local_25e0 + lVar51 * 4);
              lVar51 = 0;
              if (uVar59 != 0) {
                for (; (uVar59 >> lVar51 & 1) == 0; lVar51 = lVar51 + 1) {
                }
              }
              uVar3 = *(ulong *)(uVar66 + lVar51 * 8);
              uVar109 = *(uint *)(local_25e0 + lVar51 * 4);
              uVar59 = uVar59 - 1 & uVar59;
              if (uVar59 == 0) {
                if (uVar107 < uVar109) {
                  *(ulong *)*pauVar56 = uVar3;
                  *(uint *)(*pauVar56 + 8) = uVar109;
                  pauVar56 = pauVar56 + 1;
                }
                else {
                  *(ulong *)*pauVar56 = uVar67;
                  *(uint *)(*pauVar56 + 8) = uVar107;
                  pauVar56 = pauVar56 + 1;
                  uVar67 = uVar3;
                }
              }
              else {
                auVar78._8_8_ = 0;
                auVar78._0_8_ = uVar67;
                auVar78 = vpunpcklqdq_avx(auVar78,ZEXT416(uVar107));
                auVar91._8_8_ = 0;
                auVar91._0_8_ = uVar3;
                auVar91 = vpunpcklqdq_avx(auVar91,ZEXT416(uVar109));
                lVar51 = 0;
                if (uVar59 != 0) {
                  for (; (uVar59 >> lVar51 & 1) == 0; lVar51 = lVar51 + 1) {
                  }
                }
                auVar97._8_8_ = 0;
                auVar97._0_8_ = *(ulong *)(uVar66 + lVar51 * 8);
                auVar79 = vpunpcklqdq_avx(auVar97,ZEXT416(*(uint *)(local_25e0 + lVar51 * 4)));
                auVar97 = vpcmpgtd_avx(auVar91,auVar78);
                uVar59 = uVar59 - 1 & uVar59;
                if (uVar59 == 0) {
                  auVar98 = vpshufd_avx(auVar97,0xaa);
                  auVar97 = vblendvps_avx(auVar91,auVar78,auVar98);
                  auVar78 = vblendvps_avx(auVar78,auVar91,auVar98);
                  auVar91 = vpcmpgtd_avx(auVar79,auVar97);
                  auVar98 = vpshufd_avx(auVar91,0xaa);
                  auVar91 = vblendvps_avx(auVar79,auVar97,auVar98);
                  auVar97 = vblendvps_avx(auVar97,auVar79,auVar98);
                  auVar79 = vpcmpgtd_avx(auVar97,auVar78);
                  auVar98 = vpshufd_avx(auVar79,0xaa);
                  auVar79 = vblendvps_avx(auVar97,auVar78,auVar98);
                  auVar78 = vblendvps_avx(auVar78,auVar97,auVar98);
                  *pauVar56 = auVar78;
                  pauVar56[1] = auVar79;
                  uVar67 = auVar91._0_8_;
                  pauVar56 = pauVar56 + 2;
                }
                else {
                  lVar51 = 0;
                  if (uVar59 != 0) {
                    for (; (uVar59 >> lVar51 & 1) == 0; lVar51 = lVar51 + 1) {
                    }
                  }
                  auVar98._8_8_ = 0;
                  auVar98._0_8_ = *(ulong *)(uVar66 + lVar51 * 8);
                  auVar98 = vpunpcklqdq_avx(auVar98,ZEXT416(*(uint *)(local_25e0 + lVar51 * 4)));
                  uVar59 = uVar59 - 1 & uVar59;
                  if (uVar59 == 0) {
                    auVar69 = vpshufd_avx(auVar97,0xaa);
                    auVar97 = vblendvps_avx(auVar91,auVar78,auVar69);
                    auVar78 = vblendvps_avx(auVar78,auVar91,auVar69);
                    auVar91 = vpcmpgtd_avx(auVar98,auVar79);
                    auVar69 = vpshufd_avx(auVar91,0xaa);
                    auVar91 = vblendvps_avx(auVar98,auVar79,auVar69);
                    auVar79 = vblendvps_avx(auVar79,auVar98,auVar69);
                    auVar98 = vpcmpgtd_avx(auVar79,auVar78);
                    auVar69 = vpshufd_avx(auVar98,0xaa);
                    auVar98 = vblendvps_avx(auVar79,auVar78,auVar69);
                    auVar78 = vblendvps_avx(auVar78,auVar79,auVar69);
                    auVar79 = vpcmpgtd_avx(auVar91,auVar97);
                    auVar69 = vpshufd_avx(auVar79,0xaa);
                    auVar79 = vblendvps_avx(auVar91,auVar97,auVar69);
                    auVar91 = vblendvps_avx(auVar97,auVar91,auVar69);
                    auVar97 = vpcmpgtd_avx(auVar98,auVar91);
                    auVar69 = vpshufd_avx(auVar97,0xaa);
                    auVar97 = vblendvps_avx(auVar98,auVar91,auVar69);
                    auVar91 = vblendvps_avx(auVar91,auVar98,auVar69);
                    *pauVar56 = auVar78;
                    pauVar56[1] = auVar91;
                    pauVar56[2] = auVar97;
                    uVar67 = auVar79._0_8_;
                    pauVar54 = pauVar56 + 3;
                  }
                  else {
                    *pauVar56 = auVar78;
                    pauVar56[1] = auVar91;
                    pauVar56[2] = auVar79;
                    pauVar56[3] = auVar98;
                    lVar51 = 0x30;
                    do {
                      lVar65 = lVar51;
                      lVar51 = 0;
                      if (uVar59 != 0) {
                        for (; (uVar59 >> lVar51 & 1) == 0; lVar51 = lVar51 + 1) {
                        }
                      }
                      auVar79._8_8_ = 0;
                      auVar79._0_8_ = *(ulong *)(uVar66 + lVar51 * 8);
                      auVar78 = vpunpcklqdq_avx(auVar79,ZEXT416(*(uint *)(local_25e0 + lVar51 * 4)))
                      ;
                      *(undefined1 (*) [16])(pauVar56[1] + lVar65) = auVar78;
                      uVar59 = uVar59 & uVar59 - 1;
                      lVar51 = lVar65 + 0x10;
                    } while (uVar59 != 0);
                    pauVar54 = (undefined1 (*) [16])(pauVar56[1] + lVar65);
                    if (lVar65 + 0x10 != 0) {
                      lVar51 = 0x10;
                      pauVar55 = pauVar56;
                      do {
                        auVar78 = pauVar55[1];
                        uVar107 = *(uint *)(pauVar55[1] + 8);
                        pauVar55 = pauVar55 + 1;
                        lVar65 = lVar51;
                        do {
                          if (uVar107 <= *(uint *)(pauVar56[-1] + lVar65 + 8)) {
                            pauVar58 = (undefined1 (*) [16])(*pauVar56 + lVar65);
                            break;
                          }
                          *(undefined1 (*) [16])(*pauVar56 + lVar65) =
                               *(undefined1 (*) [16])(pauVar56[-1] + lVar65);
                          lVar65 = lVar65 + -0x10;
                          pauVar58 = pauVar56;
                        } while (lVar65 != 0);
                        *pauVar58 = auVar78;
                        lVar51 = lVar51 + 0x10;
                      } while (pauVar54 != pauVar55);
                    }
                    uVar67 = *(ulong *)*pauVar54;
                  }
                  auVar101 = ZEXT3264(auVar100);
                  auVar103 = ZEXT3264(auVar102);
                  auVar105 = ZEXT3264(auVar104);
                  auVar106 = ZEXT3264(auVar106._0_32_);
                  auVar108 = ZEXT3264(auVar108._0_32_);
                  auVar112 = ZEXT3264(auVar112._0_32_);
                  auVar117 = ZEXT3264(auVar117._0_32_);
                  pauVar56 = pauVar54;
                  iVar48 = 0;
                }
              }
            }
          }
        }
        else {
          iVar48 = 6;
        }
      } while (iVar48 == 0);
    } while (iVar48 != 6);
    lVar51 = (ulong)((uint)uVar67 & 0xf) - 8;
    if (lVar51 != 0) {
      uVar67 = uVar67 & 0xfffffffffffffff0;
      lVar65 = 0;
      do {
        lVar53 = lVar65 * 0xb0;
        pfVar1 = (float *)(uVar67 + 0x80 + lVar53);
        fVar22 = *pfVar1;
        fVar23 = pfVar1[1];
        fVar24 = pfVar1[2];
        fVar25 = pfVar1[3];
        pfVar1 = (float *)(uVar67 + 0x40 + lVar53);
        fVar26 = *pfVar1;
        fVar27 = pfVar1[1];
        fVar28 = pfVar1[2];
        fVar29 = pfVar1[3];
        auVar69._0_4_ = fVar22 * fVar26;
        auVar69._4_4_ = fVar23 * fVar27;
        auVar69._8_4_ = fVar24 * fVar28;
        auVar69._12_4_ = fVar25 * fVar29;
        pfVar1 = (float *)(uVar67 + 0x70 + lVar53);
        fVar30 = *pfVar1;
        fVar31 = pfVar1[1];
        fVar32 = pfVar1[2];
        fVar33 = pfVar1[3];
        pfVar1 = (float *)(uVar67 + 0x50 + lVar53);
        fVar34 = *pfVar1;
        fVar35 = pfVar1[1];
        fVar36 = pfVar1[2];
        fVar37 = pfVar1[3];
        auVar80._0_4_ = fVar30 * fVar34;
        auVar80._4_4_ = fVar31 * fVar35;
        auVar80._8_4_ = fVar32 * fVar36;
        auVar80._12_4_ = fVar33 * fVar37;
        local_2550 = vsubps_avx(auVar80,auVar69);
        pfVar1 = (float *)(uVar67 + 0x60 + lVar53);
        fVar38 = *pfVar1;
        fVar39 = pfVar1[1];
        fVar40 = pfVar1[2];
        fVar41 = pfVar1[3];
        auVar81._0_4_ = fVar38 * fVar34;
        auVar81._4_4_ = fVar39 * fVar35;
        auVar81._8_4_ = fVar40 * fVar36;
        auVar81._12_4_ = fVar41 * fVar37;
        pfVar1 = (float *)(uVar67 + 0x30 + lVar53);
        fVar42 = *pfVar1;
        fVar43 = pfVar1[1];
        fVar44 = pfVar1[2];
        fVar45 = pfVar1[3];
        auVar92._0_4_ = fVar22 * fVar42;
        auVar92._4_4_ = fVar23 * fVar43;
        auVar92._8_4_ = fVar24 * fVar44;
        auVar92._12_4_ = fVar25 * fVar45;
        auVar97 = vsubps_avx(auVar92,auVar81);
        auVar93._0_4_ = fVar30 * fVar42;
        auVar93._4_4_ = fVar31 * fVar43;
        auVar93._8_4_ = fVar32 * fVar44;
        auVar93._12_4_ = fVar33 * fVar45;
        auVar113._0_4_ = fVar38 * fVar26;
        auVar113._4_4_ = fVar39 * fVar27;
        auVar113._8_4_ = fVar40 * fVar28;
        auVar113._12_4_ = fVar41 * fVar29;
        auVar79 = vsubps_avx(auVar113,auVar93);
        uVar63 = *(undefined4 *)(ray + k * 4);
        auVar114._4_4_ = uVar63;
        auVar114._0_4_ = uVar63;
        auVar114._8_4_ = uVar63;
        auVar114._12_4_ = uVar63;
        auVar98 = vsubps_avx(*(undefined1 (*) [16])(uVar67 + lVar53),auVar114);
        uVar63 = *(undefined4 *)(ray + k * 4 + 0x10);
        auVar115._4_4_ = uVar63;
        auVar115._0_4_ = uVar63;
        auVar115._8_4_ = uVar63;
        auVar115._12_4_ = uVar63;
        local_2660 = vsubps_avx(*(undefined1 (*) [16])(uVar67 + 0x10 + lVar53),auVar115);
        uVar63 = *(undefined4 *)(ray + k * 4 + 0x20);
        auVar116._4_4_ = uVar63;
        auVar116._0_4_ = uVar63;
        auVar116._8_4_ = uVar63;
        auVar116._12_4_ = uVar63;
        local_2670 = vsubps_avx(*(undefined1 (*) [16])(uVar67 + 0x20 + lVar53),auVar116);
        fVar68 = *(float *)(ray + k * 4 + 0x50);
        fVar75 = *(float *)(ray + k * 4 + 0x60);
        fVar77 = local_2670._0_4_;
        auVar118._0_4_ = fVar68 * fVar77;
        fVar6 = local_2670._4_4_;
        auVar118._4_4_ = fVar68 * fVar6;
        fVar9 = local_2670._8_4_;
        auVar118._8_4_ = fVar68 * fVar9;
        fVar12 = local_2670._12_4_;
        auVar118._12_4_ = fVar68 * fVar12;
        fVar99 = local_2660._0_4_;
        auVar119._0_4_ = fVar75 * fVar99;
        fVar7 = local_2660._4_4_;
        auVar119._4_4_ = fVar75 * fVar7;
        fVar10 = local_2660._8_4_;
        auVar119._8_4_ = fVar75 * fVar10;
        fVar13 = local_2660._12_4_;
        auVar119._12_4_ = fVar75 * fVar13;
        auVar91 = vsubps_avx(auVar119,auVar118);
        fVar76 = *(float *)(ray + k * 4 + 0x40);
        fVar5 = auVar98._0_4_;
        auVar70._0_4_ = fVar75 * fVar5;
        fVar8 = auVar98._4_4_;
        auVar70._4_4_ = fVar75 * fVar8;
        fVar11 = auVar98._8_4_;
        auVar70._8_4_ = fVar75 * fVar11;
        fVar14 = auVar98._12_4_;
        auVar70._12_4_ = fVar75 * fVar14;
        auVar82._0_4_ = fVar76 * fVar77;
        auVar82._4_4_ = fVar76 * fVar6;
        auVar82._8_4_ = fVar76 * fVar9;
        auVar82._12_4_ = fVar76 * fVar12;
        auVar69 = vsubps_avx(auVar82,auVar70);
        auVar83._0_4_ = fVar76 * fVar99;
        auVar83._4_4_ = fVar76 * fVar7;
        auVar83._8_4_ = fVar76 * fVar10;
        auVar83._12_4_ = fVar76 * fVar13;
        auVar94._0_4_ = fVar68 * fVar5;
        auVar94._4_4_ = fVar68 * fVar8;
        auVar94._8_4_ = fVar68 * fVar11;
        auVar94._12_4_ = fVar68 * fVar14;
        auVar70 = vsubps_avx(auVar94,auVar83);
        auVar95._0_4_ = local_2550._0_4_ * fVar76 + fVar68 * auVar97._0_4_ + fVar75 * auVar79._0_4_;
        auVar95._4_4_ = local_2550._4_4_ * fVar76 + fVar68 * auVar97._4_4_ + fVar75 * auVar79._4_4_;
        auVar95._8_4_ = local_2550._8_4_ * fVar76 + fVar68 * auVar97._8_4_ + fVar75 * auVar79._8_4_;
        auVar95._12_4_ =
             local_2550._12_4_ * fVar76 + fVar68 * auVar97._12_4_ + fVar75 * auVar79._12_4_;
        auVar84._8_4_ = 0x80000000;
        auVar84._0_8_ = 0x8000000080000000;
        auVar84._12_4_ = 0x80000000;
        auVar78 = vandps_avx(auVar95,auVar84);
        uVar107 = auVar78._0_4_;
        local_25e0._0_4_ =
             (float)(uVar107 ^
                    (uint)(fVar38 * auVar91._0_4_ + fVar22 * auVar70._0_4_ + fVar30 * auVar69._0_4_)
                    );
        uVar109 = auVar78._4_4_;
        local_25e0._4_4_ =
             (float)(uVar109 ^
                    (uint)(fVar39 * auVar91._4_4_ + fVar23 * auVar70._4_4_ + fVar31 * auVar69._4_4_)
                    );
        uVar110 = auVar78._8_4_;
        local_25e0._8_4_ =
             (float)(uVar110 ^
                    (uint)(fVar40 * auVar91._8_4_ + fVar24 * auVar70._8_4_ + fVar32 * auVar69._8_4_)
                    );
        uVar111 = auVar78._12_4_;
        local_25e0._12_4_ =
             (float)(uVar111 ^
                    (uint)(fVar41 * auVar91._12_4_ +
                          fVar25 * auVar70._12_4_ + fVar33 * auVar69._12_4_));
        local_25e0._16_4_ =
             (float)(uVar107 ^
                    (uint)(fVar42 * auVar91._0_4_ + fVar34 * auVar70._0_4_ + fVar26 * auVar69._0_4_)
                    );
        local_25e0._20_4_ =
             (float)(uVar109 ^
                    (uint)(fVar43 * auVar91._4_4_ + fVar35 * auVar70._4_4_ + fVar27 * auVar69._4_4_)
                    );
        local_25e0._24_4_ =
             (float)(uVar110 ^
                    (uint)(fVar44 * auVar91._8_4_ + fVar36 * auVar70._8_4_ + fVar28 * auVar69._8_4_)
                    );
        local_25e0._28_4_ =
             (float)(uVar111 ^
                    (uint)(fVar45 * auVar91._12_4_ +
                          fVar37 * auVar70._12_4_ + fVar29 * auVar69._12_4_));
        auVar69 = ZEXT816(0) << 0x20;
        auVar78 = vcmpps_avx(local_25e0._0_16_,auVar69,5);
        auVar91 = vcmpps_avx(local_25e0._16_16_,auVar69,5);
        auVar78 = vandps_avx(auVar78,auVar91);
        auVar85._8_4_ = 0x7fffffff;
        auVar85._0_8_ = 0x7fffffff7fffffff;
        auVar85._12_4_ = 0x7fffffff;
        local_25b0 = vandps_avx(auVar95,auVar85);
        auVar91 = vcmpps_avx(auVar69,auVar95,4);
        auVar78 = vandps_avx(auVar78,auVar91);
        auVar71._0_4_ = local_25e0._16_4_ + local_25e0._0_4_;
        auVar71._4_4_ = local_25e0._20_4_ + local_25e0._4_4_;
        auVar71._8_4_ = local_25e0._24_4_ + local_25e0._8_4_;
        auVar71._12_4_ = local_25e0._28_4_ + local_25e0._12_4_;
        auVar91 = vcmpps_avx(auVar71,local_25b0,2);
        auVar69 = auVar91 & auVar78;
        if ((((auVar69 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
             (auVar69 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
            (auVar69 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
            auVar69[0xf] < '\0') {
          auVar78 = vandps_avx(auVar78,auVar91);
          local_25c0._0_4_ =
               (float)(uVar107 ^
                      (uint)(local_2550._0_4_ * fVar5 +
                            fVar99 * auVar97._0_4_ + fVar77 * auVar79._0_4_));
          local_25c0._4_4_ =
               (float)(uVar109 ^
                      (uint)(local_2550._4_4_ * fVar8 +
                            fVar7 * auVar97._4_4_ + fVar6 * auVar79._4_4_));
          local_25c0._8_4_ =
               (float)(uVar110 ^
                      (uint)(local_2550._8_4_ * fVar11 +
                            fVar10 * auVar97._8_4_ + fVar9 * auVar79._8_4_));
          local_25c0._12_4_ =
               (float)(uVar111 ^
                      (uint)(local_2550._12_4_ * fVar14 +
                            fVar13 * auVar97._12_4_ + fVar12 * auVar79._12_4_));
          fVar68 = *(float *)(ray + k * 4 + 0x30);
          fVar75 = local_25b0._0_4_;
          auVar72._0_4_ = fVar75 * fVar68;
          fVar76 = local_25b0._4_4_;
          auVar72._4_4_ = fVar76 * fVar68;
          fVar77 = local_25b0._8_4_;
          auVar72._8_4_ = fVar77 * fVar68;
          fVar99 = local_25b0._12_4_;
          auVar72._12_4_ = fVar99 * fVar68;
          auVar91 = vcmpps_avx(auVar72,local_25c0,1);
          fVar68 = *(float *)(ray + k * 4 + 0x80);
          auVar86._0_4_ = fVar75 * fVar68;
          auVar86._4_4_ = fVar76 * fVar68;
          auVar86._8_4_ = fVar77 * fVar68;
          auVar86._12_4_ = fVar99 * fVar68;
          auVar69 = vcmpps_avx(local_25c0,auVar86,2);
          auVar91 = vandps_avx(auVar91,auVar69);
          auVar69 = auVar78 & auVar91;
          if ((((auVar69 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
               (auVar69 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
              (auVar69 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
              auVar69[0xf] < '\0') {
            local_2680 = vandps_avx(auVar78,auVar91);
            local_2590 = local_2680;
            local_26c0 = auVar97._0_8_;
            uStack_26b8 = auVar97._8_8_;
            local_2540 = local_26c0;
            uStack_2538 = uStack_26b8;
            local_26a0 = auVar79._0_8_;
            uStack_2698 = auVar79._8_8_;
            local_2530 = local_26a0;
            uStack_2528 = uStack_2698;
            auVar78 = vrcpps_avx(local_25b0);
            fVar68 = auVar78._0_4_;
            auVar87._0_4_ = fVar75 * fVar68;
            fVar75 = auVar78._4_4_;
            auVar87._4_4_ = fVar76 * fVar75;
            fVar76 = auVar78._8_4_;
            auVar87._8_4_ = fVar77 * fVar76;
            fVar77 = auVar78._12_4_;
            auVar87._12_4_ = fVar99 * fVar77;
            auVar96._8_4_ = 0x3f800000;
            auVar96._0_8_ = &DAT_3f8000003f800000;
            auVar96._12_4_ = 0x3f800000;
            auVar78 = vsubps_avx(auVar96,auVar87);
            fVar68 = fVar68 + fVar68 * auVar78._0_4_;
            fVar75 = fVar75 + fVar75 * auVar78._4_4_;
            fVar76 = fVar76 + fVar76 * auVar78._8_4_;
            fVar77 = fVar77 + fVar77 * auVar78._12_4_;
            local_2560._0_4_ = fVar68 * local_25c0._0_4_;
            local_2560._4_4_ = fVar75 * local_25c0._4_4_;
            local_2560._8_4_ = fVar76 * local_25c0._8_4_;
            local_2560._12_4_ = fVar77 * local_25c0._12_4_;
            auVar74 = ZEXT1664(local_2560);
            local_2580[0] = fVar68 * local_25e0._0_4_;
            local_2580[1] = fVar75 * local_25e0._4_4_;
            local_2580[2] = fVar76 * local_25e0._8_4_;
            local_2580[3] = fVar77 * local_25e0._12_4_;
            auVar88._8_4_ = 0x7f800000;
            auVar88._0_8_ = 0x7f8000007f800000;
            auVar88._12_4_ = 0x7f800000;
            auVar78 = vblendvps_avx(auVar88,local_2560,local_2680);
            local_2570[0] = fVar68 * local_25e0._16_4_;
            local_2570[1] = fVar75 * local_25e0._20_4_;
            local_2570[2] = fVar76 * local_25e0._24_4_;
            local_2570[3] = fVar77 * local_25e0._28_4_;
            auVar91 = vshufps_avx(auVar78,auVar78,0xb1);
            auVar91 = vminps_avx(auVar91,auVar78);
            auVar97 = vshufpd_avx(auVar91,auVar91,1);
            auVar91 = vminps_avx(auVar97,auVar91);
            auVar78 = vcmpps_avx(auVar78,auVar91,0);
            auVar97 = local_2680 & auVar78;
            auVar91 = vpcmpeqd_avx(auVar91,auVar91);
            if ((((auVar97 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
                 (auVar97 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                (auVar97 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                auVar97[0xf] < '\0') {
              auVar91 = auVar78;
            }
            lVar53 = lVar53 + uVar67;
            auVar78 = vandps_avx(local_2680,auVar91);
            uVar63 = vmovmskps_avx(auVar78);
            uVar66 = CONCAT44((int)((ulong)context >> 0x20),uVar63);
            pGVar60 = (Geometry *)0x0;
            if (uVar66 != 0) {
              for (; (uVar66 >> (long)pGVar60 & 1) == 0;
                  pGVar60 = (Geometry *)((long)&(pGVar60->super_RefCount)._vptr_RefCount + 1)) {
              }
            }
            uStack_2648 = auVar98._8_8_;
            local_2650 = context->scene;
            pSVar50 = context->scene;
LAB_00430093:
            uVar107 = *(uint *)(lVar53 + 0x90 + (long)pGVar60 * 4);
            pGVar49 = (pSVar50->geometries).items[uVar107].ptr;
            if ((pGVar49->mask & *(uint *)(ray + k * 4 + 0x90)) == 0) {
              *(undefined4 *)(local_2680 + (long)pGVar60 * 4) = 0;
            }
            else {
              if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                 (pGVar49->intersectionFilterN == (RTCFilterFunctionN)0x0)) {
                fVar68 = local_2580[(long)pGVar60];
                fVar75 = local_2570[(long)pGVar60];
                *(undefined4 *)(ray + k * 4 + 0x80) =
                     *(undefined4 *)(local_2560 + (long)pGVar60 * 4);
                *(undefined4 *)(ray + k * 4 + 0xc0) =
                     *(undefined4 *)(local_2550 + (long)pGVar60 * 4);
                *(undefined4 *)(ray + k * 4 + 0xd0) =
                     *(undefined4 *)((long)&local_2540 + (long)pGVar60 * 4);
                *(undefined4 *)(ray + k * 4 + 0xe0) =
                     *(undefined4 *)((long)&local_2530 + (long)pGVar60 * 4);
                *(float *)(ray + k * 4 + 0xf0) = fVar68;
                *(float *)(ray + k * 4 + 0x100) = fVar75;
                *(undefined4 *)(ray + k * 4 + 0x110) =
                     *(undefined4 *)(lVar53 + 0xa0 + (long)pGVar60 * 4);
                *(uint *)(ray + k * 4 + 0x120) = uVar107;
                *(uint *)(ray + k * 4 + 0x130) = context->user->instID[0];
                *(uint *)(ray + k * 4 + 0x140) = context->user->instPrimID[0];
                goto LAB_0042ff1b;
              }
              local_2520 = auVar74._0_16_;
              local_2670._0_8_ = uVar57;
              local_2660._0_8_ = pauVar56;
              fVar68 = local_2580[(long)pGVar60];
              local_24e0._4_4_ = fVar68;
              local_24e0._0_4_ = fVar68;
              local_24e0._8_4_ = fVar68;
              local_24e0._12_4_ = fVar68;
              local_24d0 = local_2570[(long)pGVar60];
              local_24b0 = vshufps_avx(ZEXT416(uVar107),ZEXT416(uVar107),0);
              uVar63 = *(undefined4 *)(lVar53 + 0xa0 + (long)pGVar60 * 4);
              local_24c0._4_4_ = uVar63;
              local_24c0._0_4_ = uVar63;
              local_24c0._8_4_ = uVar63;
              local_24c0._12_4_ = uVar63;
              uVar63 = *(undefined4 *)(local_2550 + (long)pGVar60 * 4);
              uVar2 = *(undefined4 *)((long)&local_2540 + (long)pGVar60 * 4);
              local_2500._4_4_ = uVar2;
              local_2500._0_4_ = uVar2;
              local_2500._8_4_ = uVar2;
              local_2500._12_4_ = uVar2;
              uVar2 = *(undefined4 *)((long)&local_2530 + (long)pGVar60 * 4);
              local_24f0._4_4_ = uVar2;
              local_24f0._0_4_ = uVar2;
              local_24f0._8_4_ = uVar2;
              local_24f0._12_4_ = uVar2;
              local_2510[0] = (RTCHitN)(char)uVar63;
              local_2510[1] = (RTCHitN)(char)((uint)uVar63 >> 8);
              local_2510[2] = (RTCHitN)(char)((uint)uVar63 >> 0x10);
              local_2510[3] = (RTCHitN)(char)((uint)uVar63 >> 0x18);
              local_2510[4] = (RTCHitN)(char)uVar63;
              local_2510[5] = (RTCHitN)(char)((uint)uVar63 >> 8);
              local_2510[6] = (RTCHitN)(char)((uint)uVar63 >> 0x10);
              local_2510[7] = (RTCHitN)(char)((uint)uVar63 >> 0x18);
              local_2510[8] = (RTCHitN)(char)uVar63;
              local_2510[9] = (RTCHitN)(char)((uint)uVar63 >> 8);
              local_2510[10] = (RTCHitN)(char)((uint)uVar63 >> 0x10);
              local_2510[0xb] = (RTCHitN)(char)((uint)uVar63 >> 0x18);
              local_2510[0xc] = (RTCHitN)(char)uVar63;
              local_2510[0xd] = (RTCHitN)(char)((uint)uVar63 >> 8);
              local_2510[0xe] = (RTCHitN)(char)((uint)uVar63 >> 0x10);
              local_2510[0xf] = (RTCHitN)(char)((uint)uVar63 >> 0x18);
              fStack_24cc = local_24d0;
              fStack_24c8 = local_24d0;
              fStack_24c4 = local_24d0;
              vcmpps_avx(ZEXT1632(local_24e0),ZEXT1632(local_24e0),0xf);
              uStack_249c = context->user->instID[0];
              local_24a0 = uStack_249c;
              uStack_2498 = uStack_249c;
              uStack_2494 = uStack_249c;
              uStack_2490 = context->user->instPrimID[0];
              uStack_248c = uStack_2490;
              uStack_2488 = uStack_2490;
              uStack_2484 = uStack_2490;
              uVar63 = *(undefined4 *)(ray + k * 4 + 0x80);
              *(undefined4 *)(ray + k * 4 + 0x80) = *(undefined4 *)(local_2560 + (long)pGVar60 * 4);
              local_2640 = *local_2620;
              uStack_2638 = local_2620[1];
              local_2610.valid = (int *)&local_2640;
              local_2610.geometryUserPtr = pGVar49->userPtr;
              local_2610.context = context->user;
              local_2610.hit = local_2510;
              local_2610.N = 4;
              local_2630 = lVar51;
              local_2628 = uVar61;
              local_2610.ray = (RTCRayN *)ray;
              if (pGVar49->intersectionFilterN != (RTCFilterFunctionN)0x0) {
                (*pGVar49->intersectionFilterN)(&local_2610);
              }
              auVar46._8_8_ = uStack_2638;
              auVar46._0_8_ = local_2640;
              if (auVar46 == (undefined1  [16])0x0) {
                auVar78 = vpcmpeqd_avx((undefined1  [16])0x0,_DAT_01feba10);
                auVar78 = auVar78 ^ _DAT_01febe20;
              }
              else {
                p_Var4 = context->args->filter;
                if ((p_Var4 != (RTCFilterFunctionN)0x0) &&
                   (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                     RTC_RAY_QUERY_FLAG_INCOHERENT || (((pGVar49->field_8).field_0x2 & 0x40) != 0)))
                   ) {
                  (*p_Var4)(&local_2610);
                }
                auVar47._8_8_ = uStack_2638;
                auVar47._0_8_ = local_2640;
                auVar91 = vpcmpeqd_avx(auVar47,_DAT_01feba10);
                auVar78 = auVar91 ^ _DAT_01febe20;
                if (auVar47 != (undefined1  [16])0x0) {
                  auVar91 = auVar91 ^ _DAT_01febe20;
                  auVar97 = vmaskmovps_avx(auVar91,*(undefined1 (*) [16])local_2610.hit);
                  *(undefined1 (*) [16])(local_2610.ray + 0xc0) = auVar97;
                  auVar97 = vmaskmovps_avx(auVar91,*(undefined1 (*) [16])(local_2610.hit + 0x10));
                  *(undefined1 (*) [16])(local_2610.ray + 0xd0) = auVar97;
                  auVar97 = vmaskmovps_avx(auVar91,*(undefined1 (*) [16])(local_2610.hit + 0x20));
                  *(undefined1 (*) [16])(local_2610.ray + 0xe0) = auVar97;
                  auVar97 = vmaskmovps_avx(auVar91,*(undefined1 (*) [16])(local_2610.hit + 0x30));
                  *(undefined1 (*) [16])(local_2610.ray + 0xf0) = auVar97;
                  auVar97 = vmaskmovps_avx(auVar91,*(undefined1 (*) [16])(local_2610.hit + 0x40));
                  *(undefined1 (*) [16])(local_2610.ray + 0x100) = auVar97;
                  auVar97 = vmaskmovps_avx(auVar91,*(undefined1 (*) [16])(local_2610.hit + 0x50));
                  *(undefined1 (*) [16])(local_2610.ray + 0x110) = auVar97;
                  auVar97 = vmaskmovps_avx(auVar91,*(undefined1 (*) [16])(local_2610.hit + 0x60));
                  *(undefined1 (*) [16])(local_2610.ray + 0x120) = auVar97;
                  auVar97 = vmaskmovps_avx(auVar91,*(undefined1 (*) [16])(local_2610.hit + 0x70));
                  *(undefined1 (*) [16])(local_2610.ray + 0x130) = auVar97;
                  auVar91 = vmaskmovps_avx(auVar91,*(undefined1 (*) [16])(local_2610.hit + 0x80));
                  *(undefined1 (*) [16])(local_2610.ray + 0x140) = auVar91;
                }
              }
              auVar90._8_8_ = 0x100000001;
              auVar90._0_8_ = 0x100000001;
              if ((auVar90 & auVar78) == (undefined1  [16])0x0) {
                *(undefined4 *)(ray + k * 4 + 0x80) = uVar63;
              }
              *(undefined4 *)(local_2680 + (long)pGVar60 * 4) = 0;
              uVar63 = *(undefined4 *)(ray + k * 4 + 0x80);
              auVar73._4_4_ = uVar63;
              auVar73._0_4_ = uVar63;
              auVar73._8_4_ = uVar63;
              auVar73._12_4_ = uVar63;
              auVar74 = ZEXT1664(local_2520);
              auVar78 = vcmpps_avx(local_2520,auVar73,2);
              local_2680 = vandps_avx(auVar78,local_2680);
              pGVar49 = pGVar60;
              lVar51 = local_2630;
              pauVar56 = (undefined1 (*) [16])local_2660._0_8_;
              uVar57 = local_2670._0_8_;
              uVar61 = local_2628;
            }
            if ((((local_2680 >> 0x1f & (undefined1  [16])0x1) == (undefined1  [16])0x0 &&
                 (local_2680 >> 0x3f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                (local_2680 >> 0x5f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                -1 < local_2680[0xf]) goto LAB_0042ff1b;
            auVar89._8_4_ = 0x7f800000;
            auVar89._0_8_ = 0x7f8000007f800000;
            auVar89._12_4_ = 0x7f800000;
            auVar78 = vblendvps_avx(auVar89,auVar74._0_16_,local_2680);
            auVar91 = vshufps_avx(auVar78,auVar78,0xb1);
            auVar91 = vminps_avx(auVar91,auVar78);
            auVar97 = vshufpd_avx(auVar91,auVar91,1);
            auVar91 = vminps_avx(auVar97,auVar91);
            auVar91 = vcmpps_avx(auVar78,auVar91,0);
            auVar97 = local_2680 & auVar91;
            auVar78 = local_2680;
            if ((((auVar97 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
                 (auVar97 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                (auVar97 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                auVar97[0xf] < '\0') {
              auVar78 = vandps_avx(auVar91,local_2680);
            }
            uVar63 = vmovmskps_avx(auVar78);
            uVar66 = CONCAT44((int)((ulong)pGVar49 >> 0x20),uVar63);
            pGVar60 = (Geometry *)0x0;
            pSVar50 = local_2650;
            if (uVar66 != 0) {
              for (; (uVar66 >> (long)pGVar60 & 1) == 0;
                  pGVar60 = (Geometry *)((long)&(pGVar60->super_RefCount)._vptr_RefCount + 1)) {
              }
            }
            goto LAB_00430093;
          }
        }
LAB_0042ff1b:
        lVar65 = lVar65 + 1;
      } while (lVar65 != lVar51);
    }
    uVar63 = *(undefined4 *)(ray + k * 4 + 0x80);
    auVar74 = ZEXT3264(CONCAT428(uVar63,CONCAT424(uVar63,CONCAT420(uVar63,CONCAT416(uVar63,CONCAT412
                                                  (uVar63,CONCAT48(uVar63,CONCAT44(uVar63,uVar63))))
                                                  ))));
    auVar101 = ZEXT3264(local_23c0);
    auVar103 = ZEXT3264(local_23e0);
    auVar105 = ZEXT3264(local_2400);
    auVar106 = ZEXT3264(local_2420);
    auVar108 = ZEXT3264(local_2440);
    auVar112 = ZEXT3264(local_2460);
    auVar117 = ZEXT3264(local_2480);
  } while( true );
}

Assistant:

void BVHNIntersectorKHybrid<N, K, types, robust, PrimitiveIntersectorK, single>::intersect1(Accel::Intersectors* This,
                                                                                                const BVH* bvh,
                                                                                                NodeRef root,
                                                                                                size_t k,
                                                                                                Precalculations& pre,
                                                                                                RayHitK<K>& ray,
                                                                                                const TravRayK<K, robust>& tray,
                                                                                                RayQueryContext* context)
    {
      /* stack state */
      StackItemT<NodeRef> stack[stackSizeSingle];  // stack of nodes
      StackItemT<NodeRef>* stackPtr = stack + 1;   // current stack pointer
      StackItemT<NodeRef>* stackEnd = stack + stackSizeSingle;
      stack[0].ptr = root;
      stack[0].dist = neg_inf;

      /* load the ray into SIMD registers */
      TravRay<N,robust> tray1;
      tray1.template init<K>(k, tray.org, tray.dir, tray.rdir, tray.nearXYZ, tray.tnear[k], tray.tfar[k]);

      /* pop loop */
      while (true) pop:
      {
        /* pop next node */
        if (unlikely(stackPtr == stack)) break;
        stackPtr--;
        NodeRef cur = NodeRef(stackPtr->ptr);

        /* if popped node is too far, pop next one */
        if (unlikely(*(float*)&stackPtr->dist > ray.tfar[k]))
          continue;

        /* downtraversal loop */
        while (true)
        {
          /* intersect node */
          size_t mask; vfloat<N> tNear;
          STAT3(normal.trav_nodes, 1, 1, 1);
          bool nodeIntersected = BVHNNodeIntersector1<N, types, robust>::intersect(cur, tray1, ray.time()[k], tNear, mask);
          if (unlikely(!nodeIntersected)) { STAT3(normal.trav_nodes,-1,-1,-1); break; }

          /* if no child is hit, pop next node */
          if (unlikely(mask == 0))
            goto pop;

          /* select next child and push other children */
          BVHNNodeTraverser1Hit<N, types>::traverseClosestHit(cur, mask, tNear, stackPtr, stackEnd);
        }

        /* this is a leaf node */
        assert(cur != BVH::emptyNode);
        STAT3(normal.trav_leaves, 1, 1, 1);
        size_t num; Primitive* prim = (Primitive*)cur.leaf(num);

        size_t lazy_node = 0;
        PrimitiveIntersectorK::intersect(This, pre, ray, k, context, prim, num, tray1, lazy_node);

        tray1.tfar = ray.tfar[k];

        if (unlikely(lazy_node)) {
          stackPtr->ptr = lazy_node;
          stackPtr->dist = neg_inf;
          stackPtr++;
        }
      }
    }